

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O1

PageBitVector * __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::GetUnAllocatedPages
          (PageBitVector *__return_storage_ptr__,PageSegmentBase<Memory::VirtualAllocWrapper> *this)

{
  ulong *puVar1;
  Type TVar2;
  Type TVar3;
  Type TVar4;
  long lVar5;
  
  __return_storage_ptr__->data[4].word = (this->freePages).data[4].word;
  TVar2 = (this->freePages).data[0].word;
  TVar3 = (this->freePages).data[1].word;
  TVar4 = (this->freePages).data[3].word;
  __return_storage_ptr__->data[2].word = (this->freePages).data[2].word;
  __return_storage_ptr__->data[3].word = TVar4;
  __return_storage_ptr__->data[0].word = TVar2;
  __return_storage_ptr__->data[1].word = TVar3;
  lVar5 = 0;
  do {
    puVar1 = (ulong *)((long)&__return_storage_ptr__->data[0].word + lVar5);
    *puVar1 = *puVar1 | *(ulong *)((long)&(this->decommitPages).data[0].word + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x28);
  return __return_storage_ptr__;
}

Assistant:

PageBitVector GetUnAllocatedPages() const
    {
        PageBitVector unallocPages = freePages;
        unallocPages.Or(&decommitPages);
        return unallocPages;
    }